

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_format.cpp
# Opt level: O0

void __thiscall format_decimal_Test::TestBody(format_decimal_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_1dc8;
  Message local_1dc0;
  unsigned_long local_1db8;
  string local_1db0;
  string local_1d90;
  undefined1 local_1d70 [8];
  AssertionResult gtest_ar_72;
  Message local_1d58;
  unsigned_long local_1d50;
  string local_1d48;
  string local_1d28;
  undefined1 local_1d08 [8];
  AssertionResult gtest_ar_71;
  Message local_1cf0;
  long local_1ce8;
  string local_1ce0;
  string local_1cc0;
  undefined1 local_1ca0 [8];
  AssertionResult gtest_ar_70;
  Message local_1c88;
  long local_1c80;
  string local_1c78;
  string local_1c58;
  undefined1 local_1c38 [8];
  AssertionResult gtest_ar_69;
  Message local_1c20;
  long local_1c18;
  string local_1c10;
  string local_1bf0;
  undefined1 local_1bd0 [8];
  AssertionResult gtest_ar_68;
  Message local_1bb8;
  long local_1bb0;
  string local_1ba8;
  string local_1b88;
  undefined1 local_1b68 [8];
  AssertionResult gtest_ar_67;
  Message local_1b50;
  unsigned_long_long local_1b48;
  string local_1b40;
  string local_1b20;
  undefined1 local_1b00 [8];
  AssertionResult gtest_ar_66;
  Message local_1ae8;
  unsigned_long_long local_1ae0;
  string local_1ad8;
  string local_1ab8;
  undefined1 local_1a98 [8];
  AssertionResult gtest_ar_65;
  Message local_1a80;
  longlong local_1a78;
  string local_1a70;
  string local_1a50;
  undefined1 local_1a30 [8];
  AssertionResult gtest_ar_64;
  Message local_1a18;
  longlong local_1a10;
  string local_1a08;
  string local_19e8;
  undefined1 local_19c8 [8];
  AssertionResult gtest_ar_63;
  Message local_19b0;
  longlong local_19a8;
  string local_19a0;
  string local_1980;
  undefined1 local_1960 [8];
  AssertionResult gtest_ar_62;
  Message local_1948;
  unsigned_long local_1940;
  string local_1938;
  string local_1918;
  undefined1 local_18f8 [8];
  AssertionResult gtest_ar_61;
  Message local_18e0;
  unsigned_long local_18d8;
  string local_18d0;
  string local_18b0;
  undefined1 local_1890 [8];
  AssertionResult gtest_ar_60;
  Message local_1878;
  long local_1870;
  string local_1868;
  string local_1848;
  undefined1 local_1828 [8];
  AssertionResult gtest_ar_59;
  Message local_1810;
  long local_1808;
  string local_1800;
  string local_17e0;
  undefined1 local_17c0 [8];
  AssertionResult gtest_ar_58;
  Message local_17a8;
  long local_17a0;
  string local_1798;
  string local_1778;
  undefined1 local_1758 [8];
  AssertionResult gtest_ar_57;
  Message local_1740;
  uint local_1734;
  string local_1730;
  string local_1710;
  undefined1 local_16f0 [8];
  AssertionResult gtest_ar_56;
  Message local_16d8;
  uint local_16cc;
  string local_16c8;
  string local_16a8;
  undefined1 local_1688 [8];
  AssertionResult gtest_ar_55;
  Message local_1670;
  int local_1664;
  string local_1660;
  string local_1640;
  undefined1 local_1620 [8];
  AssertionResult gtest_ar_54;
  Message local_1608;
  int local_15fc;
  string local_15f8;
  string local_15d8;
  undefined1 local_15b8 [8];
  AssertionResult gtest_ar_53;
  Message local_15a0;
  int local_1594;
  string local_1590;
  string local_1570;
  undefined1 local_1550 [8];
  AssertionResult gtest_ar_52;
  Message local_1538;
  int local_152c;
  string local_1528;
  string local_1508;
  undefined1 local_14e8 [8];
  AssertionResult gtest_ar_51;
  Message local_14d0;
  uint local_14c4;
  string local_14c0;
  string local_14a0;
  undefined1 local_1480 [8];
  AssertionResult gtest_ar_50;
  Message local_1468;
  uint local_145c;
  string local_1458;
  string local_1438;
  undefined1 local_1418 [8];
  AssertionResult gtest_ar_49;
  Message local_1400;
  int local_13f4;
  string local_13f0;
  string local_13d0;
  undefined1 local_13b0 [8];
  AssertionResult gtest_ar_48;
  Message local_1398;
  int local_138c;
  string local_1388;
  string local_1368;
  undefined1 local_1348 [8];
  AssertionResult gtest_ar_47;
  Message local_1330;
  int local_1324;
  string local_1320;
  string local_1300;
  undefined1 local_12e0 [8];
  AssertionResult gtest_ar_46;
  Message local_12c8;
  unsigned_short local_12ba;
  string local_12b8;
  string local_1298;
  undefined1 local_1278 [8];
  AssertionResult gtest_ar_45;
  Message local_1260;
  unsigned_short local_1252;
  string local_1250;
  string local_1230;
  undefined1 local_1210 [8];
  AssertionResult gtest_ar_44;
  Message local_11f8;
  short local_11ea;
  string local_11e8;
  string local_11c8;
  undefined1 local_11a8 [8];
  AssertionResult gtest_ar_43;
  Message local_1190;
  short local_1182;
  string local_1180;
  string local_1160;
  undefined1 local_1140 [8];
  AssertionResult gtest_ar_42;
  Message local_1128;
  short local_111a;
  string local_1118;
  string local_10f8;
  undefined1 local_10d8 [8];
  AssertionResult gtest_ar_41;
  Message local_10c0;
  short local_10b2;
  string local_10b0;
  string local_1090;
  undefined1 local_1070 [8];
  AssertionResult gtest_ar_40;
  Message local_1058;
  unsigned_short local_104a;
  string local_1048;
  string local_1028;
  undefined1 local_1008 [8];
  AssertionResult gtest_ar_39;
  Message local_ff0;
  unsigned_short local_fe2;
  string local_fe0;
  string local_fc0;
  undefined1 local_fa0 [8];
  AssertionResult gtest_ar_38;
  Message local_f88;
  short local_f7a;
  string local_f78;
  string local_f58;
  undefined1 local_f38 [8];
  AssertionResult gtest_ar_37;
  Message local_f20;
  short local_f12;
  string local_f10;
  string local_ef0;
  undefined1 local_ed0 [8];
  AssertionResult gtest_ar_36;
  Message local_eb8;
  short local_eaa;
  string local_ea8;
  string local_e88;
  undefined1 local_e68 [8];
  AssertionResult gtest_ar_35;
  Message local_e50;
  uchar local_e41;
  string local_e40;
  string local_e20;
  undefined1 local_e00 [8];
  AssertionResult gtest_ar_34;
  Message local_de8;
  uchar local_dd9;
  string local_dd8;
  string local_db8;
  undefined1 local_d98 [8];
  AssertionResult gtest_ar_33;
  Message local_d80;
  char local_d71;
  string local_d70;
  string local_d50;
  undefined1 local_d30 [8];
  AssertionResult gtest_ar_32;
  Message local_d18;
  char local_d09;
  string local_d08;
  string local_ce8;
  undefined1 local_cc8 [8];
  AssertionResult gtest_ar_31;
  Message local_cb0;
  char local_ca1;
  string local_ca0;
  string local_c80;
  undefined1 local_c60 [8];
  AssertionResult gtest_ar_30;
  Message local_c48;
  char local_c39;
  string local_c38;
  string local_c18;
  undefined1 local_bf8 [8];
  AssertionResult gtest_ar_29;
  Message local_be0;
  uchar local_bd1;
  string local_bd0;
  string local_bb0;
  undefined1 local_b90 [8];
  AssertionResult gtest_ar_28;
  Message local_b78;
  uchar local_b69;
  string local_b68;
  string local_b48;
  undefined1 local_b28 [8];
  AssertionResult gtest_ar_27;
  Message local_b10;
  char local_b01;
  string local_b00;
  string local_ae0;
  undefined1 local_ac0 [8];
  AssertionResult gtest_ar_26;
  Message local_aa8;
  char local_a99;
  string local_a98;
  string local_a78;
  undefined1 local_a58 [8];
  AssertionResult gtest_ar_25;
  Message local_a40;
  char local_a31;
  string local_a30;
  string local_a10;
  undefined1 local_9f0 [8];
  AssertionResult gtest_ar_24;
  Message local_9d8;
  wchar_t local_9cc;
  string local_9c8;
  string local_9a8;
  undefined1 local_988 [8];
  AssertionResult gtest_ar_23;
  Message local_970;
  wchar_t local_964;
  string local_960;
  string local_940;
  undefined1 local_920 [8];
  AssertionResult gtest_ar_22;
  Message local_908;
  wchar_t local_8fc;
  string local_8f8;
  string local_8d8;
  undefined1 local_8b8 [8];
  AssertionResult gtest_ar_21;
  Message local_8a0;
  char local_891;
  string local_890;
  string local_870;
  undefined1 local_850 [8];
  AssertionResult gtest_ar_20;
  Message local_838;
  char local_829;
  string local_828;
  string local_808;
  undefined1 local_7e8 [8];
  AssertionResult gtest_ar_19;
  Message local_7d0;
  int local_7c4;
  string local_7c0;
  string local_7a0;
  undefined1 local_780 [8];
  AssertionResult gtest_ar_18;
  Message local_768;
  int local_75c;
  string local_758;
  string local_738;
  undefined1 local_718 [8];
  AssertionResult gtest_ar_17;
  Message local_700;
  int local_6f4;
  string local_6f0;
  string local_6d0;
  undefined1 local_6b0 [8];
  AssertionResult gtest_ar_16;
  Message local_698;
  int local_68c;
  string local_688;
  string local_668;
  undefined1 local_648 [8];
  AssertionResult gtest_ar_15;
  Message local_630;
  int local_624;
  string local_620;
  string local_600;
  undefined1 local_5e0 [8];
  AssertionResult gtest_ar_14;
  Message local_5c8;
  int local_5bc;
  string local_5b8;
  string local_598;
  undefined1 local_578 [8];
  AssertionResult gtest_ar_13;
  Message local_560;
  int local_554;
  string local_550;
  string local_530;
  undefined1 local_510 [8];
  AssertionResult gtest_ar_12;
  Message local_4f8;
  int local_4ec;
  string local_4e8;
  string local_4c8;
  undefined1 local_4a8 [8];
  AssertionResult gtest_ar_11;
  Message local_490;
  int local_484;
  string local_480;
  string local_460;
  undefined1 local_440 [8];
  AssertionResult gtest_ar_10;
  Message local_428;
  int local_41c;
  string local_418;
  string local_3f8;
  undefined1 local_3d8 [8];
  AssertionResult gtest_ar_9;
  Message local_3c0;
  int local_3b4;
  string local_3b0;
  string local_390;
  undefined1 local_370 [8];
  AssertionResult gtest_ar_8;
  Message local_358;
  int local_34c;
  string local_348;
  string local_328;
  undefined1 local_308 [8];
  AssertionResult gtest_ar_7;
  Message local_2f0;
  int local_2e4;
  string local_2e0;
  string local_2c0;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar_6;
  Message local_288;
  int local_27c;
  string local_278;
  string local_258;
  undefined1 local_238 [8];
  AssertionResult gtest_ar_5;
  Message local_220;
  int local_214;
  string local_210;
  string local_1f0;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_4;
  Message local_1b8;
  int local_1ac;
  string local_1a8;
  string local_188;
  undefined1 local_168 [8];
  AssertionResult gtest_ar_3;
  Message local_150;
  int local_144;
  string local_140;
  string local_120;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_2;
  Message local_e8;
  int local_dc;
  string local_d8;
  string local_b8;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_1;
  Message local_80 [3];
  int local_64;
  string local_60;
  string local_40;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  format_decimal_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  ST::string::from_validated(&local_40,"xx1234xx",8);
  local_64 = 0x4d2;
  ST::format<int>(&local_60,"xx{}xx",&local_64);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_20,
             "ST::string::from_validated(\"\" \"xx1234xx\" \"\", sizeof(\"xx1234xx\") - 1)",
             "ST::format(\"xx{}xx\", 1234)",&local_40,&local_60);
  ST::string::~string(&local_60);
  ST::string::~string(&local_40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_80);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0xf2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  ST::string::from_validated(&local_b8,"xx1234xx",8);
  local_dc = 0x4d2;
  ST::format<int>(&local_d8,"xx{d}xx",&local_dc);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_98,
             "ST::string::from_validated(\"\" \"xx1234xx\" \"\", sizeof(\"xx1234xx\") - 1)",
             "ST::format(\"xx{d}xx\", 1234)",&local_b8,&local_d8);
  ST::string::~string(&local_d8);
  ST::string::~string(&local_b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0xf3,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  ST::string::from_validated(&local_120,"xx1234xx",8);
  local_144 = 0x4d2;
  ST::format<int>(&local_140,"xx{2}xx",&local_144);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_100,
             "ST::string::from_validated(\"\" \"xx1234xx\" \"\", sizeof(\"xx1234xx\") - 1)",
             "ST::format(\"xx{2}xx\", 1234)",&local_120,&local_140);
  ST::string::~string(&local_140);
  ST::string::~string(&local_120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_150);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0xf4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_150);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  ST::string::from_validated(&local_188,"xx1234xx",8);
  local_1ac = 0x4d2;
  ST::format<int>(&local_1a8,"xx{>2}xx",&local_1ac);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_168,
             "ST::string::from_validated(\"\" \"xx1234xx\" \"\", sizeof(\"xx1234xx\") - 1)",
             "ST::format(\"xx{>2}xx\", 1234)",&local_188,&local_1a8);
  ST::string::~string(&local_1a8);
  ST::string::~string(&local_188);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(&local_1b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0xf5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_1b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_1b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  ST::string::from_validated(&local_1f0,"xx1234xx",8);
  local_214 = 0x4d2;
  ST::format<int>(&local_210,"xx{<2}xx",&local_214);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_1d0,
             "ST::string::from_validated(\"\" \"xx1234xx\" \"\", sizeof(\"xx1234xx\") - 1)",
             "ST::format(\"xx{<2}xx\", 1234)",&local_1f0,&local_210);
  ST::string::~string(&local_210);
  ST::string::~string(&local_1f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar1) {
    testing::Message::Message(&local_220);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0xf6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_220);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  ST::string::from_validated(&local_258,"xx  1234xx",10);
  local_27c = 0x4d2;
  ST::format<int>(&local_278,"xx{6}xx",&local_27c);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_238,
             "ST::string::from_validated(\"\" \"xx  1234xx\" \"\", sizeof(\"xx  1234xx\") - 1)",
             "ST::format(\"xx{6}xx\", 1234)",&local_258,&local_278);
  ST::string::~string(&local_278);
  ST::string::~string(&local_258);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
  if (!bVar1) {
    testing::Message::Message(&local_288);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_238);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0xf7,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_288);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_288);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
  ST::string::from_validated(&local_2c0,"xx  1234xx",10);
  local_2e4 = 0x4d2;
  ST::format<int>(&local_2e0,"xx{>6}xx",&local_2e4);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_2a0,
             "ST::string::from_validated(\"\" \"xx  1234xx\" \"\", sizeof(\"xx  1234xx\") - 1)",
             "ST::format(\"xx{>6}xx\", 1234)",&local_2c0,&local_2e0);
  ST::string::~string(&local_2e0);
  ST::string::~string(&local_2c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
  if (!bVar1) {
    testing::Message::Message(&local_2f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0xf8,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_2f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_2f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
  ST::string::from_validated(&local_328,"xx1234  xx",10);
  local_34c = 0x4d2;
  ST::format<int>(&local_348,"xx{<6}xx",&local_34c);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_308,
             "ST::string::from_validated(\"\" \"xx1234  xx\" \"\", sizeof(\"xx1234  xx\") - 1)",
             "ST::format(\"xx{<6}xx\", 1234)",&local_328,&local_348);
  ST::string::~string(&local_348);
  ST::string::~string(&local_328);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_308);
  if (!bVar1) {
    testing::Message::Message(&local_358);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_308);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0xf9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_358);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_358);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_308);
  ST::string::from_validated(&local_390,"xx   -1234xx",0xc);
  local_3b4 = -0x4d2;
  ST::format<int>(&local_3b0,"xx{8}xx",&local_3b4);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_370,
             "ST::string::from_validated(\"\" \"xx   -1234xx\" \"\", sizeof(\"xx   -1234xx\") - 1)",
             "ST::format(\"xx{8}xx\", -1234)",&local_390,&local_3b0);
  ST::string::~string(&local_3b0);
  ST::string::~string(&local_390);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
  if (!bVar1) {
    testing::Message::Message(&local_3c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_370);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0xfa,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_3c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_3c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
  ST::string::from_validated(&local_3f8,"xx   +1234xx",0xc);
  local_41c = 0x4d2;
  ST::format<int>(&local_418,"xx{+8}xx",&local_41c);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_3d8,
             "ST::string::from_validated(\"\" \"xx   +1234xx\" \"\", sizeof(\"xx   +1234xx\") - 1)",
             "ST::format(\"xx{+8}xx\", 1234)",&local_3f8,&local_418);
  ST::string::~string(&local_418);
  ST::string::~string(&local_3f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d8);
  if (!bVar1) {
    testing::Message::Message(&local_428);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0xfb,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_428);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_428);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d8);
  ST::string::from_validated(&local_460,"xx-1234   xx",0xc);
  local_484 = -0x4d2;
  ST::format<int>(&local_480,"xx{<8}xx",&local_484);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_440,
             "ST::string::from_validated(\"\" \"xx-1234   xx\" \"\", sizeof(\"xx-1234   xx\") - 1)",
             "ST::format(\"xx{<8}xx\", -1234)",&local_460,&local_480);
  ST::string::~string(&local_480);
  ST::string::~string(&local_460);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_440);
  if (!bVar1) {
    testing::Message::Message(&local_490);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_440);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0xfc,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_490);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_490);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_440);
  ST::string::from_validated(&local_4c8,"xx+1234   xx",0xc);
  local_4ec = 0x4d2;
  ST::format<int>(&local_4e8,"xx{<+8}xx",&local_4ec);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_4a8,
             "ST::string::from_validated(\"\" \"xx+1234   xx\" \"\", sizeof(\"xx+1234   xx\") - 1)",
             "ST::format(\"xx{<+8}xx\", 1234)",&local_4c8,&local_4e8);
  ST::string::~string(&local_4e8);
  ST::string::~string(&local_4c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a8);
  if (!bVar1) {
    testing::Message::Message(&local_4f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0xfd,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_4f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_4f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a8);
  ST::string::from_validated(&local_530,"xx1234xx",8);
  local_554 = 0x4d2;
  ST::format<int>(&local_550,"xx{.2}xx",&local_554);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_510,
             "ST::string::from_validated(\"\" \"xx1234xx\" \"\", sizeof(\"xx1234xx\") - 1)",
             "ST::format(\"xx{.2}xx\", 1234)",&local_530,&local_550);
  ST::string::~string(&local_550);
  ST::string::~string(&local_530);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_510);
  if (!bVar1) {
    testing::Message::Message(&local_560);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_510);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x100,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_560);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_560);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_510);
  ST::string::from_validated(&local_598,"xx001234xx",10);
  local_5bc = 0x4d2;
  ST::format<int>(&local_5b8,"xx{06}xx",&local_5bc);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_578,
             "ST::string::from_validated(\"\" \"xx001234xx\" \"\", sizeof(\"xx001234xx\") - 1)",
             "ST::format(\"xx{06}xx\", 1234)",&local_598,&local_5b8);
  ST::string::~string(&local_5b8);
  ST::string::~string(&local_598);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_578);
  if (!bVar1) {
    testing::Message::Message(&local_5c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_578);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x103,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_5c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_5c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_578);
  ST::string::from_validated(&local_600,"xx001234xx",10);
  local_624 = 0x4d2;
  ST::format<int>(&local_620,"xx{<06}xx",&local_624);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_5e0,
             "ST::string::from_validated(\"\" \"xx001234xx\" \"\", sizeof(\"xx001234xx\") - 1)",
             "ST::format(\"xx{<06}xx\", 1234)",&local_600,&local_620);
  ST::string::~string(&local_620);
  ST::string::~string(&local_600);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5e0);
  if (!bVar1) {
    testing::Message::Message(&local_630);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x104,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_630);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_630);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5e0);
  ST::string::from_validated(&local_668,"xx-0001234xx",0xc);
  local_68c = -0x4d2;
  ST::format<int>(&local_688,"xx{08}xx",&local_68c);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_648,
             "ST::string::from_validated(\"\" \"xx-0001234xx\" \"\", sizeof(\"xx-0001234xx\") - 1)",
             "ST::format(\"xx{08}xx\", -1234)",&local_668,&local_688);
  ST::string::~string(&local_688);
  ST::string::~string(&local_668);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_648);
  if (!bVar1) {
    testing::Message::Message(&local_698);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_648);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x105,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_698);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_698);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_648);
  ST::string::from_validated(&local_6d0,"xx+0001234xx",0xc);
  local_6f4 = 0x4d2;
  ST::format<int>(&local_6f0,"xx{+08}xx",&local_6f4);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_6b0,
             "ST::string::from_validated(\"\" \"xx+0001234xx\" \"\", sizeof(\"xx+0001234xx\") - 1)",
             "ST::format(\"xx{+08}xx\", 1234)",&local_6d0,&local_6f0);
  ST::string::~string(&local_6f0);
  ST::string::~string(&local_6d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6b0);
  if (!bVar1) {
    testing::Message::Message(&local_700);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x106,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_700);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_700);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6b0);
  ST::string::from_validated(&local_738,"xx-0001234xx",0xc);
  local_75c = -0x4d2;
  ST::format<int>(&local_758,"xx{<08}xx",&local_75c);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_718,
             "ST::string::from_validated(\"\" \"xx-0001234xx\" \"\", sizeof(\"xx-0001234xx\") - 1)",
             "ST::format(\"xx{<08}xx\", -1234)",&local_738,&local_758);
  ST::string::~string(&local_758);
  ST::string::~string(&local_738);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_718);
  if (!bVar1) {
    testing::Message::Message(&local_768);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_718);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x107,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,&local_768);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(&local_768);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_718);
  ST::string::from_validated(&local_7a0,"xx+0001234xx",0xc);
  local_7c4 = 0x4d2;
  ST::format<int>(&local_7c0,"xx{<+08}xx",&local_7c4);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_780,
             "ST::string::from_validated(\"\" \"xx+0001234xx\" \"\", sizeof(\"xx+0001234xx\") - 1)",
             "ST::format(\"xx{<+08}xx\", 1234)",&local_7a0,&local_7c0);
  ST::string::~string(&local_7c0);
  ST::string::~string(&local_7a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_780);
  if (!bVar1) {
    testing::Message::Message(&local_7d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_780);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x108,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_7d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_7d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_780);
  ST::string::from_validated(&local_808,"xx0xx",5);
  local_829 = '\0';
  ST::format<char>(&local_828,"xx{d}xx",&local_829);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_7e8,
             "ST::string::from_validated(\"\" \"xx0xx\" \"\", sizeof(\"xx0xx\") - 1)",
             "ST::format(\"xx{d}xx\", \'\\0\')",&local_808,&local_828);
  ST::string::~string(&local_828);
  ST::string::~string(&local_808);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7e8);
  if (!bVar1) {
    testing::Message::Message(&local_838);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_7e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x10b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,&local_838);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(&local_838);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7e8);
  ST::string::from_validated(&local_870,"xx65xx",6);
  local_891 = 'A';
  ST::format<char>(&local_890,"xx{d}xx",&local_891);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_850,
             "ST::string::from_validated(\"\" \"xx65xx\" \"\", sizeof(\"xx65xx\") - 1)",
             "ST::format(\"xx{d}xx\", \'A\')",&local_870,&local_890);
  ST::string::~string(&local_890);
  ST::string::~string(&local_870);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_850);
  if (!bVar1) {
    testing::Message::Message(&local_8a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_850);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x10c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,&local_8a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
    testing::Message::~Message(&local_8a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_850);
  ST::string::from_validated(&local_8d8,"xx0xx",5);
  local_8fc = L'\0';
  ST::format<wchar_t>(&local_8f8,"xx{d}xx",&local_8fc);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_8b8,
             "ST::string::from_validated(\"\" \"xx0xx\" \"\", sizeof(\"xx0xx\") - 1)",
             "ST::format(\"xx{d}xx\", L\'\\0\')",&local_8d8,&local_8f8);
  ST::string::~string(&local_8f8);
  ST::string::~string(&local_8d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8b8);
  if (!bVar1) {
    testing::Message::Message(&local_908);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_8b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x10d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,&local_908);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
    testing::Message::~Message(&local_908);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8b8);
  ST::string::from_validated(&local_940,"xx65xx",6);
  local_964 = L'A';
  ST::format<wchar_t>(&local_960,"xx{d}xx",&local_964);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_920,
             "ST::string::from_validated(\"\" \"xx65xx\" \"\", sizeof(\"xx65xx\") - 1)",
             "ST::format(\"xx{d}xx\", L\'A\')",&local_940,&local_960);
  ST::string::~string(&local_960);
  ST::string::~string(&local_940);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_920);
  if (!bVar1) {
    testing::Message::Message(&local_970);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_920);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x10e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,&local_970);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
    testing::Message::~Message(&local_970);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_920);
  ST::string::from_validated(&local_9a8,"xx32767xx",9);
  local_9cc = L'翿';
  ST::format<wchar_t>(&local_9c8,"xx{d}xx",&local_9cc);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_988,
             "ST::string::from_validated(\"\" \"xx32767xx\" \"\", sizeof(\"xx32767xx\") - 1)",
             "ST::format(\"xx{d}xx\", L\'\\u7fff\')",&local_9a8,&local_9c8);
  ST::string::~string(&local_9c8);
  ST::string::~string(&local_9a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_988);
  if (!bVar1) {
    testing::Message::Message(&local_9d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_988);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_24.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x10f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_24.message_,&local_9d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_24.message_);
    testing::Message::~Message(&local_9d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_988);
  ST::string::from_validated(&local_a10,"xx0xx",5);
  local_a31 = '\0';
  ST::format<signed_char>(&local_a30,"xx{}xx",&local_a31);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_9f0,
             "ST::string::from_validated(\"\" \"xx0xx\" \"\", sizeof(\"xx0xx\") - 1)",
             "ST::format(\"xx{}xx\", (signed char)0)",&local_a10,&local_a30);
  ST::string::~string(&local_a30);
  ST::string::~string(&local_a10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9f0);
  if (!bVar1) {
    testing::Message::Message(&local_a40);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_9f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_25.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x112,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_25.message_,&local_a40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_25.message_);
    testing::Message::~Message(&local_a40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9f0);
  ST::string::from_validated(&local_a78,"xx123xx",7);
  local_a99 = '{';
  ST::format<signed_char>(&local_a98,"xx{}xx",&local_a99);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_a58,
             "ST::string::from_validated(\"\" \"xx123xx\" \"\", sizeof(\"xx123xx\") - 1)",
             "ST::format(\"xx{}xx\", (signed char)123)",&local_a78,&local_a98);
  ST::string::~string(&local_a98);
  ST::string::~string(&local_a78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a58);
  if (!bVar1) {
    testing::Message::Message(&local_aa8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a58);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_26.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x113,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_26.message_,&local_aa8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_26.message_);
    testing::Message::~Message(&local_aa8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a58);
  ST::string::from_validated(&local_ae0,"xx-123xx",8);
  local_b01 = -0x7b;
  ST::format<signed_char>(&local_b00,"xx{}xx",&local_b01);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_ac0,
             "ST::string::from_validated(\"\" \"xx-123xx\" \"\", sizeof(\"xx-123xx\") - 1)",
             "ST::format(\"xx{}xx\", (signed char)-123)",&local_ae0,&local_b00);
  ST::string::~string(&local_b00);
  ST::string::~string(&local_ae0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ac0);
  if (!bVar1) {
    testing::Message::Message(&local_b10);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ac0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_27.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x114,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_27.message_,&local_b10);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_27.message_);
    testing::Message::~Message(&local_b10);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ac0);
  ST::string::from_validated(&local_b48,"xx0xx",5);
  local_b69 = '\0';
  ST::format<unsigned_char>(&local_b68,"xx{}xx",&local_b69);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_b28,
             "ST::string::from_validated(\"\" \"xx0xx\" \"\", sizeof(\"xx0xx\") - 1)",
             "ST::format(\"xx{}xx\", (unsigned char)0)",&local_b48,&local_b68);
  ST::string::~string(&local_b68);
  ST::string::~string(&local_b48);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b28);
  if (!bVar1) {
    testing::Message::Message(&local_b78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_28.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x115,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_28.message_,&local_b78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_28.message_);
    testing::Message::~Message(&local_b78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b28);
  ST::string::from_validated(&local_bb0,"xx123xx",7);
  local_bd1 = '{';
  ST::format<unsigned_char>(&local_bd0,"xx{}xx",&local_bd1);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_b90,
             "ST::string::from_validated(\"\" \"xx123xx\" \"\", sizeof(\"xx123xx\") - 1)",
             "ST::format(\"xx{}xx\", (unsigned char)123)",&local_bb0,&local_bd0);
  ST::string::~string(&local_bd0);
  ST::string::~string(&local_bb0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b90);
  if (!bVar1) {
    testing::Message::Message(&local_be0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x116,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29.message_,&local_be0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29.message_);
    testing::Message::~Message(&local_be0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b90);
  ST::string::from_validated(&local_c18,"xx127xx",7);
  local_c39 = std::numeric_limits<signed_char>::max();
  ST::format<signed_char>(&local_c38,"xx{}xx",&local_c39);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_bf8,
             "ST::string::from_validated(\"\" \"xx127xx\" \"\", sizeof(\"xx127xx\") - 1)",
             "ST::format(\"xx{}xx\", std::numeric_limits<int8_t>::max())",&local_c18,&local_c38);
  ST::string::~string(&local_c38);
  ST::string::~string(&local_c18);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bf8);
  if (!bVar1) {
    testing::Message::Message(&local_c48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_bf8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_30.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x117,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_30.message_,&local_c48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_30.message_);
    testing::Message::~Message(&local_c48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_bf8);
  ST::string::from_validated(&local_c80,"xx+127xx",8);
  local_ca1 = std::numeric_limits<signed_char>::max();
  ST::format<signed_char>(&local_ca0,"xx{+}xx",&local_ca1);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_c60,
             "ST::string::from_validated(\"\" \"xx+127xx\" \"\", sizeof(\"xx+127xx\") - 1)",
             "ST::format(\"xx{+}xx\", std::numeric_limits<int8_t>::max())",&local_c80,&local_ca0);
  ST::string::~string(&local_ca0);
  ST::string::~string(&local_c80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c60);
  if (!bVar1) {
    testing::Message::Message(&local_cb0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_31.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x118,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_31.message_,&local_cb0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_31.message_);
    testing::Message::~Message(&local_cb0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c60);
  ST::string::from_validated(&local_ce8,"xx-128xx",8);
  local_d09 = std::numeric_limits<signed_char>::min();
  ST::format<signed_char>(&local_d08,"xx{}xx",&local_d09);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_cc8,
             "ST::string::from_validated(\"\" \"xx-128xx\" \"\", sizeof(\"xx-128xx\") - 1)",
             "ST::format(\"xx{}xx\", std::numeric_limits<int8_t>::min())",&local_ce8,&local_d08);
  ST::string::~string(&local_d08);
  ST::string::~string(&local_ce8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cc8);
  if (!bVar1) {
    testing::Message::Message(&local_d18);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_cc8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_32.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x119,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_32.message_,&local_d18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_32.message_);
    testing::Message::~Message(&local_d18);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_cc8);
  ST::string::from_validated(&local_d50,"xx-128xx",8);
  local_d71 = std::numeric_limits<signed_char>::min();
  ST::format<signed_char>(&local_d70,"xx{+}xx",&local_d71);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_d30,
             "ST::string::from_validated(\"\" \"xx-128xx\" \"\", sizeof(\"xx-128xx\") - 1)",
             "ST::format(\"xx{+}xx\", std::numeric_limits<int8_t>::min())",&local_d50,&local_d70);
  ST::string::~string(&local_d70);
  ST::string::~string(&local_d50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d30);
  if (!bVar1) {
    testing::Message::Message(&local_d80);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_33.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x11a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_33.message_,&local_d80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_33.message_);
    testing::Message::~Message(&local_d80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d30);
  ST::string::from_validated(&local_db8,"xx255xx",7);
  local_dd9 = std::numeric_limits<unsigned_char>::max();
  ST::format<unsigned_char>(&local_dd8,"xx{}xx",&local_dd9);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_d98,
             "ST::string::from_validated(\"\" \"xx255xx\" \"\", sizeof(\"xx255xx\") - 1)",
             "ST::format(\"xx{}xx\", std::numeric_limits<uint8_t>::max())",&local_db8,&local_dd8);
  ST::string::~string(&local_dd8);
  ST::string::~string(&local_db8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d98);
  if (!bVar1) {
    testing::Message::Message(&local_de8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_34.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x11b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_34.message_,&local_de8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_34.message_);
    testing::Message::~Message(&local_de8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d98);
  ST::string::from_validated(&local_e20,"xx+255xx",8);
  local_e41 = std::numeric_limits<unsigned_char>::max();
  ST::format<unsigned_char>(&local_e40,"xx{+}xx",&local_e41);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_e00,
             "ST::string::from_validated(\"\" \"xx+255xx\" \"\", sizeof(\"xx+255xx\") - 1)",
             "ST::format(\"xx{+}xx\", std::numeric_limits<uint8_t>::max())",&local_e20,&local_e40);
  ST::string::~string(&local_e40);
  ST::string::~string(&local_e20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e00);
  if (!bVar1) {
    testing::Message::Message(&local_e50);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e00);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_35.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x11c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_35.message_,&local_e50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_35.message_);
    testing::Message::~Message(&local_e50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e00);
  ST::string::from_validated(&local_e88,"xx0xx",5);
  local_eaa = 0;
  ST::format<short>(&local_ea8,"xx{}xx",&local_eaa);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_e68,
             "ST::string::from_validated(\"\" \"xx0xx\" \"\", sizeof(\"xx0xx\") - 1)",
             "ST::format(\"xx{}xx\", (short)0)",&local_e88,&local_ea8);
  ST::string::~string(&local_ea8);
  ST::string::~string(&local_e88);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e68);
  if (!bVar1) {
    testing::Message::Message(&local_eb8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_36.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x11f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_36.message_,&local_eb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_36.message_);
    testing::Message::~Message(&local_eb8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e68);
  ST::string::from_validated(&local_ef0,"xx123xx",7);
  local_f12 = 0x7b;
  ST::format<short>(&local_f10,"xx{}xx",&local_f12);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_ed0,
             "ST::string::from_validated(\"\" \"xx123xx\" \"\", sizeof(\"xx123xx\") - 1)",
             "ST::format(\"xx{}xx\", (short)123)",&local_ef0,&local_f10);
  ST::string::~string(&local_f10);
  ST::string::~string(&local_ef0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ed0);
  if (!bVar1) {
    testing::Message::Message(&local_f20);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ed0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_37.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x120,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_37.message_,&local_f20);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_37.message_);
    testing::Message::~Message(&local_f20);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ed0);
  ST::string::from_validated(&local_f58,"xx-123xx",8);
  local_f7a = -0x7b;
  ST::format<short>(&local_f78,"xx{}xx",&local_f7a);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_f38,
             "ST::string::from_validated(\"\" \"xx-123xx\" \"\", sizeof(\"xx-123xx\") - 1)",
             "ST::format(\"xx{}xx\", (short)-123)",&local_f58,&local_f78);
  ST::string::~string(&local_f78);
  ST::string::~string(&local_f58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f38);
  if (!bVar1) {
    testing::Message::Message(&local_f88);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_38.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x121,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_38.message_,&local_f88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_38.message_);
    testing::Message::~Message(&local_f88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f38);
  ST::string::from_validated(&local_fc0,"xx0xx",5);
  local_fe2 = 0;
  ST::format<unsigned_short>(&local_fe0,"xx{}xx",&local_fe2);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_fa0,
             "ST::string::from_validated(\"\" \"xx0xx\" \"\", sizeof(\"xx0xx\") - 1)",
             "ST::format(\"xx{}xx\", (unsigned short)0)",&local_fc0,&local_fe0);
  ST::string::~string(&local_fe0);
  ST::string::~string(&local_fc0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_fa0);
  if (!bVar1) {
    testing::Message::Message(&local_ff0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_fa0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_39.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x122,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_39.message_,&local_ff0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_39.message_);
    testing::Message::~Message(&local_ff0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_fa0);
  ST::string::from_validated(&local_1028,"xx123xx",7);
  local_104a = 0x7b;
  ST::format<unsigned_short>(&local_1048,"xx{}xx",&local_104a);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_1008,
             "ST::string::from_validated(\"\" \"xx123xx\" \"\", sizeof(\"xx123xx\") - 1)",
             "ST::format(\"xx{}xx\", (unsigned short)123)",&local_1028,&local_1048);
  ST::string::~string(&local_1048);
  ST::string::~string(&local_1028);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1008);
  if (!bVar1) {
    testing::Message::Message(&local_1058);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1008);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_40.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x123,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_40.message_,&local_1058);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_40.message_);
    testing::Message::~Message(&local_1058);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1008);
  ST::string::from_validated(&local_1090,"xx32767xx",9);
  local_10b2 = std::numeric_limits<short>::max();
  ST::format<short>(&local_10b0,"xx{}xx",&local_10b2);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_1070,
             "ST::string::from_validated(\"\" \"xx32767xx\" \"\", sizeof(\"xx32767xx\") - 1)",
             "ST::format(\"xx{}xx\", std::numeric_limits<int16_t>::max())",&local_1090,&local_10b0);
  ST::string::~string(&local_10b0);
  ST::string::~string(&local_1090);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1070);
  if (!bVar1) {
    testing::Message::Message(&local_10c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1070);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_41.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x124,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_41.message_,&local_10c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_41.message_);
    testing::Message::~Message(&local_10c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1070);
  ST::string::from_validated(&local_10f8,"xx+32767xx",10);
  local_111a = std::numeric_limits<short>::max();
  ST::format<short>(&local_1118,"xx{+}xx",&local_111a);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_10d8,
             "ST::string::from_validated(\"\" \"xx+32767xx\" \"\", sizeof(\"xx+32767xx\") - 1)",
             "ST::format(\"xx{+}xx\", std::numeric_limits<int16_t>::max())",&local_10f8,&local_1118)
  ;
  ST::string::~string(&local_1118);
  ST::string::~string(&local_10f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_10d8);
  if (!bVar1) {
    testing::Message::Message(&local_1128);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_10d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_42.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x125,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_42.message_,&local_1128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_42.message_);
    testing::Message::~Message(&local_1128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_10d8);
  ST::string::from_validated(&local_1160,"xx-32768xx",10);
  local_1182 = std::numeric_limits<short>::min();
  ST::format<short>(&local_1180,"xx{}xx",&local_1182);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_1140,
             "ST::string::from_validated(\"\" \"xx-32768xx\" \"\", sizeof(\"xx-32768xx\") - 1)",
             "ST::format(\"xx{}xx\", std::numeric_limits<int16_t>::min())",&local_1160,&local_1180);
  ST::string::~string(&local_1180);
  ST::string::~string(&local_1160);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1140);
  if (!bVar1) {
    testing::Message::Message(&local_1190);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1140);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_43.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x126,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_43.message_,&local_1190);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_43.message_);
    testing::Message::~Message(&local_1190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1140);
  ST::string::from_validated(&local_11c8,"xx-32768xx",10);
  local_11ea = std::numeric_limits<short>::min();
  ST::format<short>(&local_11e8,"xx{+}xx",&local_11ea);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_11a8,
             "ST::string::from_validated(\"\" \"xx-32768xx\" \"\", sizeof(\"xx-32768xx\") - 1)",
             "ST::format(\"xx{+}xx\", std::numeric_limits<int16_t>::min())",&local_11c8,&local_11e8)
  ;
  ST::string::~string(&local_11e8);
  ST::string::~string(&local_11c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_11a8);
  if (!bVar1) {
    testing::Message::Message(&local_11f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_11a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_44.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x127,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_44.message_,&local_11f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_44.message_);
    testing::Message::~Message(&local_11f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_11a8);
  ST::string::from_validated(&local_1230,"xx65535xx",9);
  local_1252 = std::numeric_limits<unsigned_short>::max();
  ST::format<unsigned_short>(&local_1250,"xx{}xx",&local_1252);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_1210,
             "ST::string::from_validated(\"\" \"xx65535xx\" \"\", sizeof(\"xx65535xx\") - 1)",
             "ST::format(\"xx{}xx\", std::numeric_limits<uint16_t>::max())",&local_1230,&local_1250)
  ;
  ST::string::~string(&local_1250);
  ST::string::~string(&local_1230);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1210);
  if (!bVar1) {
    testing::Message::Message(&local_1260);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1210);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_45.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x128,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_45.message_,&local_1260);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_45.message_);
    testing::Message::~Message(&local_1260);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1210);
  ST::string::from_validated(&local_1298,"xx+65535xx",10);
  local_12ba = std::numeric_limits<unsigned_short>::max();
  ST::format<unsigned_short>(&local_12b8,"xx{+}xx",&local_12ba);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_1278,
             "ST::string::from_validated(\"\" \"xx+65535xx\" \"\", sizeof(\"xx+65535xx\") - 1)",
             "ST::format(\"xx{+}xx\", std::numeric_limits<uint16_t>::max())",&local_1298,&local_12b8
            );
  ST::string::~string(&local_12b8);
  ST::string::~string(&local_1298);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1278);
  if (!bVar1) {
    testing::Message::Message(&local_12c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1278);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_46.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x129,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_46.message_,&local_12c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_46.message_);
    testing::Message::~Message(&local_12c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1278);
  ST::string::from_validated(&local_1300,"xx0xx",5);
  local_1324 = 0;
  ST::format<int>(&local_1320,"xx{}xx",&local_1324);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_12e0,
             "ST::string::from_validated(\"\" \"xx0xx\" \"\", sizeof(\"xx0xx\") - 1)",
             "ST::format(\"xx{}xx\", (int)0)",&local_1300,&local_1320);
  ST::string::~string(&local_1320);
  ST::string::~string(&local_1300);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_12e0);
  if (!bVar1) {
    testing::Message::Message(&local_1330);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_12e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_47.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,300,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_47.message_,&local_1330);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_47.message_);
    testing::Message::~Message(&local_1330);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_12e0);
  ST::string::from_validated(&local_1368,"xx123xx",7);
  local_138c = 0x7b;
  ST::format<int>(&local_1388,"xx{}xx",&local_138c);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_1348,
             "ST::string::from_validated(\"\" \"xx123xx\" \"\", sizeof(\"xx123xx\") - 1)",
             "ST::format(\"xx{}xx\", (int)123)",&local_1368,&local_1388);
  ST::string::~string(&local_1388);
  ST::string::~string(&local_1368);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1348);
  if (!bVar1) {
    testing::Message::Message(&local_1398);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1348);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_48.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x12d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_48.message_,&local_1398);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_48.message_);
    testing::Message::~Message(&local_1398);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1348);
  ST::string::from_validated(&local_13d0,"xx-123xx",8);
  local_13f4 = -0x7b;
  ST::format<int>(&local_13f0,"xx{}xx",&local_13f4);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_13b0,
             "ST::string::from_validated(\"\" \"xx-123xx\" \"\", sizeof(\"xx-123xx\") - 1)",
             "ST::format(\"xx{}xx\", (int)-123)",&local_13d0,&local_13f0);
  ST::string::~string(&local_13f0);
  ST::string::~string(&local_13d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_13b0);
  if (!bVar1) {
    testing::Message::Message(&local_1400);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_13b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_49.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x12e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_49.message_,&local_1400);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_49.message_);
    testing::Message::~Message(&local_1400);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_13b0);
  ST::string::from_validated(&local_1438,"xx0xx",5);
  local_145c = 0;
  ST::format<unsigned_int>(&local_1458,"xx{}xx",&local_145c);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_1418,
             "ST::string::from_validated(\"\" \"xx0xx\" \"\", sizeof(\"xx0xx\") - 1)",
             "ST::format(\"xx{}xx\", (unsigned int)0)",&local_1438,&local_1458);
  ST::string::~string(&local_1458);
  ST::string::~string(&local_1438);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1418);
  if (!bVar1) {
    testing::Message::Message(&local_1468);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1418);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_50.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x12f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_50.message_,&local_1468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_50.message_);
    testing::Message::~Message(&local_1468);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1418);
  ST::string::from_validated(&local_14a0,"xx123xx",7);
  local_14c4 = 0x7b;
  ST::format<unsigned_int>(&local_14c0,"xx{}xx",&local_14c4);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_1480,
             "ST::string::from_validated(\"\" \"xx123xx\" \"\", sizeof(\"xx123xx\") - 1)",
             "ST::format(\"xx{}xx\", (unsigned int)123)",&local_14a0,&local_14c0);
  ST::string::~string(&local_14c0);
  ST::string::~string(&local_14a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1480);
  if (!bVar1) {
    testing::Message::Message(&local_14d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1480);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_51.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x130,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_51.message_,&local_14d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_51.message_);
    testing::Message::~Message(&local_14d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1480);
  ST::string::from_validated(&local_1508,"xx2147483647xx",0xe);
  local_152c = std::numeric_limits<int>::max();
  ST::format<int>(&local_1528,"xx{}xx",&local_152c);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_14e8,
             "ST::string::from_validated(\"\" \"xx2147483647xx\" \"\", sizeof(\"xx2147483647xx\") - 1)"
             ,"ST::format(\"xx{}xx\", std::numeric_limits<int32_t>::max())",&local_1508,&local_1528)
  ;
  ST::string::~string(&local_1528);
  ST::string::~string(&local_1508);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_14e8);
  if (!bVar1) {
    testing::Message::Message(&local_1538);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_14e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_52.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x131,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_52.message_,&local_1538);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_52.message_);
    testing::Message::~Message(&local_1538);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_14e8);
  ST::string::from_validated(&local_1570,"xx+2147483647xx",0xf);
  local_1594 = std::numeric_limits<int>::max();
  ST::format<int>(&local_1590,"xx{+}xx",&local_1594);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_1550,
             "ST::string::from_validated(\"\" \"xx+2147483647xx\" \"\", sizeof(\"xx+2147483647xx\") - 1)"
             ,"ST::format(\"xx{+}xx\", std::numeric_limits<int32_t>::max())",&local_1570,&local_1590
            );
  ST::string::~string(&local_1590);
  ST::string::~string(&local_1570);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1550);
  if (!bVar1) {
    testing::Message::Message(&local_15a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1550);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_53.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x132,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_53.message_,&local_15a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_53.message_);
    testing::Message::~Message(&local_15a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1550);
  ST::string::from_validated(&local_15d8,"xx-2147483648xx",0xf);
  local_15fc = std::numeric_limits<int>::min();
  ST::format<int>(&local_15f8,"xx{}xx",&local_15fc);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_15b8,
             "ST::string::from_validated(\"\" \"xx-2147483648xx\" \"\", sizeof(\"xx-2147483648xx\") - 1)"
             ,"ST::format(\"xx{}xx\", std::numeric_limits<int32_t>::min())",&local_15d8,&local_15f8)
  ;
  ST::string::~string(&local_15f8);
  ST::string::~string(&local_15d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_15b8);
  if (!bVar1) {
    testing::Message::Message(&local_1608);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_15b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_54.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x133,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_54.message_,&local_1608);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_54.message_);
    testing::Message::~Message(&local_1608);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_15b8);
  ST::string::from_validated(&local_1640,"xx-2147483648xx",0xf);
  local_1664 = std::numeric_limits<int>::min();
  ST::format<int>(&local_1660,"xx{+}xx",&local_1664);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_1620,
             "ST::string::from_validated(\"\" \"xx-2147483648xx\" \"\", sizeof(\"xx-2147483648xx\") - 1)"
             ,"ST::format(\"xx{+}xx\", std::numeric_limits<int32_t>::min())",&local_1640,&local_1660
            );
  ST::string::~string(&local_1660);
  ST::string::~string(&local_1640);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1620);
  if (!bVar1) {
    testing::Message::Message(&local_1670);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1620);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_55.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x134,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_55.message_,&local_1670);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_55.message_);
    testing::Message::~Message(&local_1670);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1620);
  ST::string::from_validated(&local_16a8,"xx4294967295xx",0xe);
  local_16cc = std::numeric_limits<unsigned_int>::max();
  ST::format<unsigned_int>(&local_16c8,"xx{}xx",&local_16cc);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_1688,
             "ST::string::from_validated(\"\" \"xx4294967295xx\" \"\", sizeof(\"xx4294967295xx\") - 1)"
             ,"ST::format(\"xx{}xx\", std::numeric_limits<uint32_t>::max())",&local_16a8,&local_16c8
            );
  ST::string::~string(&local_16c8);
  ST::string::~string(&local_16a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1688);
  if (!bVar1) {
    testing::Message::Message(&local_16d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1688);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_56.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x135,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_56.message_,&local_16d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_56.message_);
    testing::Message::~Message(&local_16d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1688);
  ST::string::from_validated(&local_1710,"xx+4294967295xx",0xf);
  local_1734 = std::numeric_limits<unsigned_int>::max();
  ST::format<unsigned_int>(&local_1730,"xx{+}xx",&local_1734);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_16f0,
             "ST::string::from_validated(\"\" \"xx+4294967295xx\" \"\", sizeof(\"xx+4294967295xx\") - 1)"
             ,"ST::format(\"xx{+}xx\", std::numeric_limits<uint32_t>::max())",&local_1710,
             &local_1730);
  ST::string::~string(&local_1730);
  ST::string::~string(&local_1710);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_16f0);
  if (!bVar1) {
    testing::Message::Message(&local_1740);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_16f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_57.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x136,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_57.message_,&local_1740);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_57.message_);
    testing::Message::~Message(&local_1740);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_16f0);
  ST::string::from_validated(&local_1778,"xx0xx",5);
  local_17a0 = 0;
  ST::format<long>(&local_1798,"xx{}xx",&local_17a0);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_1758,
             "ST::string::from_validated(\"\" \"xx0xx\" \"\", sizeof(\"xx0xx\") - 1)",
             "ST::format(\"xx{}xx\", (long)0)",&local_1778,&local_1798);
  ST::string::~string(&local_1798);
  ST::string::~string(&local_1778);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1758);
  if (!bVar1) {
    testing::Message::Message(&local_17a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1758);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_58.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x138,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_58.message_,&local_17a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_58.message_);
    testing::Message::~Message(&local_17a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1758);
  ST::string::from_validated(&local_17e0,"xx123xx",7);
  local_1808 = 0x7b;
  ST::format<long>(&local_1800,"xx{}xx",&local_1808);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_17c0,
             "ST::string::from_validated(\"\" \"xx123xx\" \"\", sizeof(\"xx123xx\") - 1)",
             "ST::format(\"xx{}xx\", (long)123)",&local_17e0,&local_1800);
  ST::string::~string(&local_1800);
  ST::string::~string(&local_17e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_17c0);
  if (!bVar1) {
    testing::Message::Message(&local_1810);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_17c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_59.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x139,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_59.message_,&local_1810);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_59.message_);
    testing::Message::~Message(&local_1810);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_17c0);
  ST::string::from_validated(&local_1848,"xx-123xx",8);
  local_1870 = -0x7b;
  ST::format<long>(&local_1868,"xx{}xx",&local_1870);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_1828,
             "ST::string::from_validated(\"\" \"xx-123xx\" \"\", sizeof(\"xx-123xx\") - 1)",
             "ST::format(\"xx{}xx\", (long)-123)",&local_1848,&local_1868);
  ST::string::~string(&local_1868);
  ST::string::~string(&local_1848);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1828);
  if (!bVar1) {
    testing::Message::Message(&local_1878);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1828);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_60.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x13a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_60.message_,&local_1878);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_60.message_);
    testing::Message::~Message(&local_1878);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1828);
  ST::string::from_validated(&local_18b0,"xx0xx",5);
  local_18d8 = 0;
  ST::format<unsigned_long>(&local_18d0,"xx{}xx",&local_18d8);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_1890,
             "ST::string::from_validated(\"\" \"xx0xx\" \"\", sizeof(\"xx0xx\") - 1)",
             "ST::format(\"xx{}xx\", (unsigned long)0)",&local_18b0,&local_18d0);
  ST::string::~string(&local_18d0);
  ST::string::~string(&local_18b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1890);
  if (!bVar1) {
    testing::Message::Message(&local_18e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1890);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_61.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x13b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_61.message_,&local_18e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_61.message_);
    testing::Message::~Message(&local_18e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1890);
  ST::string::from_validated(&local_1918,"xx123xx",7);
  local_1940 = 0x7b;
  ST::format<unsigned_long>(&local_1938,"xx{}xx",&local_1940);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_18f8,
             "ST::string::from_validated(\"\" \"xx123xx\" \"\", sizeof(\"xx123xx\") - 1)",
             "ST::format(\"xx{}xx\", (unsigned long)123)",&local_1918,&local_1938);
  ST::string::~string(&local_1938);
  ST::string::~string(&local_1918);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_18f8);
  if (!bVar1) {
    testing::Message::Message(&local_1948);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_18f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_62.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x13c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_62.message_,&local_1948);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_62.message_);
    testing::Message::~Message(&local_1948);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_18f8);
  ST::string::from_validated(&local_1980,"xx0xx",5);
  local_19a8 = 0;
  ST::format<long_long>(&local_19a0,"xx{}xx",&local_19a8);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_1960,
             "ST::string::from_validated(\"\" \"xx0xx\" \"\", sizeof(\"xx0xx\") - 1)",
             "ST::format(\"xx{}xx\", (long long)0)",&local_1980,&local_19a0);
  ST::string::~string(&local_19a0);
  ST::string::~string(&local_1980);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1960);
  if (!bVar1) {
    testing::Message::Message(&local_19b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1960);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_63.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x13f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_63.message_,&local_19b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_63.message_);
    testing::Message::~Message(&local_19b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1960);
  ST::string::from_validated(&local_19e8,"xx123xx",7);
  local_1a10 = 0x7b;
  ST::format<long_long>(&local_1a08,"xx{}xx",&local_1a10);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_19c8,
             "ST::string::from_validated(\"\" \"xx123xx\" \"\", sizeof(\"xx123xx\") - 1)",
             "ST::format(\"xx{}xx\", (long long)123)",&local_19e8,&local_1a08);
  ST::string::~string(&local_1a08);
  ST::string::~string(&local_19e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_19c8);
  if (!bVar1) {
    testing::Message::Message(&local_1a18);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_19c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_64.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x140,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_64.message_,&local_1a18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_64.message_);
    testing::Message::~Message(&local_1a18);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_19c8);
  ST::string::from_validated(&local_1a50,"xx-123xx",8);
  local_1a78 = -0x7b;
  ST::format<long_long>(&local_1a70,"xx{}xx",&local_1a78);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_1a30,
             "ST::string::from_validated(\"\" \"xx-123xx\" \"\", sizeof(\"xx-123xx\") - 1)",
             "ST::format(\"xx{}xx\", (long long)-123)",&local_1a50,&local_1a70);
  ST::string::~string(&local_1a70);
  ST::string::~string(&local_1a50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a30);
  if (!bVar1) {
    testing::Message::Message(&local_1a80);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_65.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x141,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_65.message_,&local_1a80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_65.message_);
    testing::Message::~Message(&local_1a80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a30);
  ST::string::from_validated(&local_1ab8,"xx0xx",5);
  local_1ae0 = 0;
  ST::format<unsigned_long_long>(&local_1ad8,"xx{}xx",&local_1ae0);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_1a98,
             "ST::string::from_validated(\"\" \"xx0xx\" \"\", sizeof(\"xx0xx\") - 1)",
             "ST::format(\"xx{}xx\", (unsigned long long)0)",&local_1ab8,&local_1ad8);
  ST::string::~string(&local_1ad8);
  ST::string::~string(&local_1ab8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a98);
  if (!bVar1) {
    testing::Message::Message(&local_1ae8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_66.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x142,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_66.message_,&local_1ae8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_66.message_);
    testing::Message::~Message(&local_1ae8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a98);
  ST::string::from_validated(&local_1b20,"xx123xx",7);
  local_1b48 = 0x7b;
  ST::format<unsigned_long_long>(&local_1b40,"xx{}xx",&local_1b48);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_1b00,
             "ST::string::from_validated(\"\" \"xx123xx\" \"\", sizeof(\"xx123xx\") - 1)",
             "ST::format(\"xx{}xx\", (unsigned long long)123)",&local_1b20,&local_1b40);
  ST::string::~string(&local_1b40);
  ST::string::~string(&local_1b20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b00);
  if (!bVar1) {
    testing::Message::Message(&local_1b50);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b00);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_67.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x143,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_67.message_,&local_1b50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_67.message_);
    testing::Message::~Message(&local_1b50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b00);
  ST::string::from_validated(&local_1b88,"xx9223372036854775807xx",0x17);
  local_1bb0 = std::numeric_limits<long>::max();
  ST::format<long>(&local_1ba8,"xx{}xx",&local_1bb0);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_1b68,
             "ST::string::from_validated(\"\" \"xx9223372036854775807xx\" \"\", sizeof(\"xx9223372036854775807xx\") - 1)"
             ,"ST::format(\"xx{}xx\", std::numeric_limits<int64_t>::max())",&local_1b88,&local_1ba8)
  ;
  ST::string::~string(&local_1ba8);
  ST::string::~string(&local_1b88);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b68);
  if (!bVar1) {
    testing::Message::Message(&local_1bb8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_68.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x145,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_68.message_,&local_1bb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_68.message_);
    testing::Message::~Message(&local_1bb8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b68);
  ST::string::from_validated(&local_1bf0,"xx+9223372036854775807xx",0x18);
  local_1c18 = std::numeric_limits<long>::max();
  ST::format<long>(&local_1c10,"xx{+}xx",&local_1c18);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_1bd0,
             "ST::string::from_validated(\"\" \"xx+9223372036854775807xx\" \"\", sizeof(\"xx+9223372036854775807xx\") - 1)"
             ,"ST::format(\"xx{+}xx\", std::numeric_limits<int64_t>::max())",&local_1bf0,&local_1c10
            );
  ST::string::~string(&local_1c10);
  ST::string::~string(&local_1bf0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1bd0);
  if (!bVar1) {
    testing::Message::Message(&local_1c20);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1bd0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_69.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x146,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_69.message_,&local_1c20);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_69.message_);
    testing::Message::~Message(&local_1c20);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1bd0);
  ST::string::from_validated(&local_1c58,"xx-9223372036854775808xx",0x18);
  local_1c80 = std::numeric_limits<long>::min();
  ST::format<long>(&local_1c78,"xx{}xx",&local_1c80);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_1c38,
             "ST::string::from_validated(\"\" \"xx-9223372036854775808xx\" \"\", sizeof(\"xx-9223372036854775808xx\") - 1)"
             ,"ST::format(\"xx{}xx\", std::numeric_limits<int64_t>::min())",&local_1c58,&local_1c78)
  ;
  ST::string::~string(&local_1c78);
  ST::string::~string(&local_1c58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c38);
  if (!bVar1) {
    testing::Message::Message(&local_1c88);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1c38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_70.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x147,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_70.message_,&local_1c88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_70.message_);
    testing::Message::~Message(&local_1c88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c38);
  ST::string::from_validated(&local_1cc0,"xx-9223372036854775808xx",0x18);
  local_1ce8 = std::numeric_limits<long>::min();
  ST::format<long>(&local_1ce0,"xx{+}xx",&local_1ce8);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_1ca0,
             "ST::string::from_validated(\"\" \"xx-9223372036854775808xx\" \"\", sizeof(\"xx-9223372036854775808xx\") - 1)"
             ,"ST::format(\"xx{+}xx\", std::numeric_limits<int64_t>::min())",&local_1cc0,&local_1ce0
            );
  ST::string::~string(&local_1ce0);
  ST::string::~string(&local_1cc0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1ca0);
  if (!bVar1) {
    testing::Message::Message(&local_1cf0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1ca0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_71.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x148,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_71.message_,&local_1cf0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_71.message_);
    testing::Message::~Message(&local_1cf0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1ca0);
  ST::string::from_validated(&local_1d28,"xx18446744073709551615xx",0x18);
  local_1d50 = std::numeric_limits<unsigned_long>::max();
  ST::format<unsigned_long>(&local_1d48,"xx{}xx",&local_1d50);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_1d08,
             "ST::string::from_validated(\"\" \"xx18446744073709551615xx\" \"\", sizeof(\"xx18446744073709551615xx\") - 1)"
             ,"ST::format(\"xx{}xx\", std::numeric_limits<uint64_t>::max())",&local_1d28,&local_1d48
            );
  ST::string::~string(&local_1d48);
  ST::string::~string(&local_1d28);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d08);
  if (!bVar1) {
    testing::Message::Message(&local_1d58);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d08);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_72.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x149,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_72.message_,&local_1d58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_72.message_);
    testing::Message::~Message(&local_1d58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d08);
  ST::string::from_validated(&local_1d90,"xx+18446744073709551615xx",0x19);
  local_1db8 = std::numeric_limits<unsigned_long>::max();
  ST::format<unsigned_long>(&local_1db0,"xx{+}xx",&local_1db8);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_1d70,
             "ST::string::from_validated(\"\" \"xx+18446744073709551615xx\" \"\", sizeof(\"xx+18446744073709551615xx\") - 1)"
             ,"ST::format(\"xx{+}xx\", std::numeric_limits<uint64_t>::max())",&local_1d90,
             &local_1db0);
  ST::string::~string(&local_1db0);
  ST::string::~string(&local_1d90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d70);
  if (!bVar1) {
    testing::Message::Message(&local_1dc0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d70);
    testing::internal::AssertHelper::AssertHelper
              (&local_1dc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x14a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1dc8,&local_1dc0);
    testing::internal::AssertHelper::~AssertHelper(&local_1dc8);
    testing::Message::~Message(&local_1dc0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d70);
  return;
}

Assistant:

TEST(format, decimal)
{
    EXPECT_EQ(ST_LITERAL("xx1234xx"), ST::format("xx{}xx", 1234));
    EXPECT_EQ(ST_LITERAL("xx1234xx"), ST::format("xx{d}xx", 1234));
    EXPECT_EQ(ST_LITERAL("xx1234xx"), ST::format("xx{2}xx", 1234));
    EXPECT_EQ(ST_LITERAL("xx1234xx"), ST::format("xx{>2}xx", 1234));
    EXPECT_EQ(ST_LITERAL("xx1234xx"), ST::format("xx{<2}xx", 1234));
    EXPECT_EQ(ST_LITERAL("xx  1234xx"), ST::format("xx{6}xx", 1234));
    EXPECT_EQ(ST_LITERAL("xx  1234xx"), ST::format("xx{>6}xx", 1234));
    EXPECT_EQ(ST_LITERAL("xx1234  xx"), ST::format("xx{<6}xx", 1234));
    EXPECT_EQ(ST_LITERAL("xx   -1234xx"), ST::format("xx{8}xx", -1234));
    EXPECT_EQ(ST_LITERAL("xx   +1234xx"), ST::format("xx{+8}xx", 1234));
    EXPECT_EQ(ST_LITERAL("xx-1234   xx"), ST::format("xx{<8}xx", -1234));
    EXPECT_EQ(ST_LITERAL("xx+1234   xx"), ST::format("xx{<+8}xx", 1234));

    // Ensure precision isn't used for numeric formatting
    EXPECT_EQ(ST_LITERAL("xx1234xx"), ST::format("xx{.2}xx", 1234));

    // Numeric padding
    EXPECT_EQ(ST_LITERAL("xx001234xx"), ST::format("xx{06}xx", 1234));
    EXPECT_EQ(ST_LITERAL("xx001234xx"), ST::format("xx{<06}xx", 1234));
    EXPECT_EQ(ST_LITERAL("xx-0001234xx"), ST::format("xx{08}xx", -1234));
    EXPECT_EQ(ST_LITERAL("xx+0001234xx"), ST::format("xx{+08}xx", 1234));
    EXPECT_EQ(ST_LITERAL("xx-0001234xx"), ST::format("xx{<08}xx", -1234));
    EXPECT_EQ(ST_LITERAL("xx+0001234xx"), ST::format("xx{<+08}xx", 1234));

    // Character types
    EXPECT_EQ(ST_LITERAL("xx0xx"), ST::format("xx{d}xx", '\0'));
    EXPECT_EQ(ST_LITERAL("xx65xx"), ST::format("xx{d}xx", 'A'));
    EXPECT_EQ(ST_LITERAL("xx0xx"), ST::format("xx{d}xx", L'\0'));
    EXPECT_EQ(ST_LITERAL("xx65xx"), ST::format("xx{d}xx", L'A'));
    EXPECT_EQ(ST_LITERAL("xx32767xx"), ST::format("xx{d}xx", L'\u7fff'));

    // 8-bit ints
    EXPECT_EQ(ST_LITERAL("xx0xx"), ST::format("xx{}xx", (signed char)0));
    EXPECT_EQ(ST_LITERAL("xx123xx"), ST::format("xx{}xx", (signed char)123));
    EXPECT_EQ(ST_LITERAL("xx-123xx"), ST::format("xx{}xx", (signed char)-123));
    EXPECT_EQ(ST_LITERAL("xx0xx"), ST::format("xx{}xx", (unsigned char)0));
    EXPECT_EQ(ST_LITERAL("xx123xx"), ST::format("xx{}xx", (unsigned char)123));
    EXPECT_EQ(ST_LITERAL("xx127xx"), ST::format("xx{}xx", std::numeric_limits<int8_t>::max()));
    EXPECT_EQ(ST_LITERAL("xx+127xx"), ST::format("xx{+}xx", std::numeric_limits<int8_t>::max()));
    EXPECT_EQ(ST_LITERAL("xx-128xx"), ST::format("xx{}xx", std::numeric_limits<int8_t>::min()));
    EXPECT_EQ(ST_LITERAL("xx-128xx"), ST::format("xx{+}xx", std::numeric_limits<int8_t>::min()));
    EXPECT_EQ(ST_LITERAL("xx255xx"), ST::format("xx{}xx", std::numeric_limits<uint8_t>::max()));
    EXPECT_EQ(ST_LITERAL("xx+255xx"), ST::format("xx{+}xx", std::numeric_limits<uint8_t>::max()));

    // 16-bit ints
    EXPECT_EQ(ST_LITERAL("xx0xx"), ST::format("xx{}xx", (short)0));
    EXPECT_EQ(ST_LITERAL("xx123xx"), ST::format("xx{}xx", (short)123));
    EXPECT_EQ(ST_LITERAL("xx-123xx"), ST::format("xx{}xx", (short)-123));
    EXPECT_EQ(ST_LITERAL("xx0xx"), ST::format("xx{}xx", (unsigned short)0));
    EXPECT_EQ(ST_LITERAL("xx123xx"), ST::format("xx{}xx", (unsigned short)123));
    EXPECT_EQ(ST_LITERAL("xx32767xx"), ST::format("xx{}xx", std::numeric_limits<int16_t>::max()));
    EXPECT_EQ(ST_LITERAL("xx+32767xx"), ST::format("xx{+}xx", std::numeric_limits<int16_t>::max()));
    EXPECT_EQ(ST_LITERAL("xx-32768xx"), ST::format("xx{}xx", std::numeric_limits<int16_t>::min()));
    EXPECT_EQ(ST_LITERAL("xx-32768xx"), ST::format("xx{+}xx", std::numeric_limits<int16_t>::min()));
    EXPECT_EQ(ST_LITERAL("xx65535xx"), ST::format("xx{}xx", std::numeric_limits<uint16_t>::max()));
    EXPECT_EQ(ST_LITERAL("xx+65535xx"), ST::format("xx{+}xx", std::numeric_limits<uint16_t>::max()));

    // 32-bit ints
    EXPECT_EQ(ST_LITERAL("xx0xx"), ST::format("xx{}xx", (int)0));
    EXPECT_EQ(ST_LITERAL("xx123xx"), ST::format("xx{}xx", (int)123));
    EXPECT_EQ(ST_LITERAL("xx-123xx"), ST::format("xx{}xx", (int)-123));
    EXPECT_EQ(ST_LITERAL("xx0xx"), ST::format("xx{}xx", (unsigned int)0));
    EXPECT_EQ(ST_LITERAL("xx123xx"), ST::format("xx{}xx", (unsigned int)123));
    EXPECT_EQ(ST_LITERAL("xx2147483647xx"), ST::format("xx{}xx", std::numeric_limits<int32_t>::max()));
    EXPECT_EQ(ST_LITERAL("xx+2147483647xx"), ST::format("xx{+}xx", std::numeric_limits<int32_t>::max()));
    EXPECT_EQ(ST_LITERAL("xx-2147483648xx"), ST::format("xx{}xx", std::numeric_limits<int32_t>::min()));
    EXPECT_EQ(ST_LITERAL("xx-2147483648xx"), ST::format("xx{+}xx", std::numeric_limits<int32_t>::min()));
    EXPECT_EQ(ST_LITERAL("xx4294967295xx"), ST::format("xx{}xx", std::numeric_limits<uint32_t>::max()));
    EXPECT_EQ(ST_LITERAL("xx+4294967295xx"), ST::format("xx{+}xx", std::numeric_limits<uint32_t>::max()));

    EXPECT_EQ(ST_LITERAL("xx0xx"), ST::format("xx{}xx", (long)0));
    EXPECT_EQ(ST_LITERAL("xx123xx"), ST::format("xx{}xx", (long)123));
    EXPECT_EQ(ST_LITERAL("xx-123xx"), ST::format("xx{}xx", (long)-123));
    EXPECT_EQ(ST_LITERAL("xx0xx"), ST::format("xx{}xx", (unsigned long)0));
    EXPECT_EQ(ST_LITERAL("xx123xx"), ST::format("xx{}xx", (unsigned long)123));

    // 64-bit ints
    EXPECT_EQ(ST_LITERAL("xx0xx"), ST::format("xx{}xx", (long long)0));
    EXPECT_EQ(ST_LITERAL("xx123xx"), ST::format("xx{}xx", (long long)123));
    EXPECT_EQ(ST_LITERAL("xx-123xx"), ST::format("xx{}xx", (long long)-123));
    EXPECT_EQ(ST_LITERAL("xx0xx"), ST::format("xx{}xx", (unsigned long long)0));
    EXPECT_EQ(ST_LITERAL("xx123xx"), ST::format("xx{}xx", (unsigned long long)123));
#ifdef ST_HAVE_INT64
    EXPECT_EQ(ST_LITERAL("xx9223372036854775807xx"), ST::format("xx{}xx", std::numeric_limits<int64_t>::max()));
    EXPECT_EQ(ST_LITERAL("xx+9223372036854775807xx"), ST::format("xx{+}xx", std::numeric_limits<int64_t>::max()));
    EXPECT_EQ(ST_LITERAL("xx-9223372036854775808xx"), ST::format("xx{}xx", std::numeric_limits<int64_t>::min()));
    EXPECT_EQ(ST_LITERAL("xx-9223372036854775808xx"), ST::format("xx{+}xx", std::numeric_limits<int64_t>::min()));
    EXPECT_EQ(ST_LITERAL("xx18446744073709551615xx"), ST::format("xx{}xx", std::numeric_limits<uint64_t>::max()));
    EXPECT_EQ(ST_LITERAL("xx+18446744073709551615xx"), ST::format("xx{+}xx", std::numeric_limits<uint64_t>::max()));
#endif
}